

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O1

void __thiscall chrono::curiosity::Curiosity::Update(Curiosity *this)

{
  undefined8 uVar1;
  double dVar2;
  element_type *peVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  
  uVar1 = *(undefined8 *)(this->m_system + 0x1a8);
  (*((this->m_driver).
     super___shared_ptr<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_CuriosityDriver[3])();
  iVar4 = (*((this->m_driver).
             super___shared_ptr<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_CuriosityDriver[2])();
  if (iVar4 == 0) {
    lVar5 = 0;
    do {
      (**(code **)(**(long **)((long)&(this->m_drive_motor_funcs)._M_elems[0].
                                      super___shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar5 * 2) + 0xd0))
                (*(undefined8 *)
                  ((long)(((this->m_driver).
                           super___shared_ptr<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->drive_speeds)._M_elems + lVar5),uVar1);
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x30);
  }
  peVar3 = (this->m_driver).
           super___shared_ptr<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  lVar5 = 0;
  do {
    dVar2 = *(double *)((long)(peVar3->steer_angles)._M_elems + lVar5);
    dVar6 = -1.4835298641951802;
    if ((-1.4835298641951802 <= dVar2) && (dVar6 = dVar2, 1.4835298641951802 < dVar2)) {
      dVar6 = 1.4835298641951802;
    }
    *(double *)
     (*(long *)((long)&(this->m_rocker_motor_funcs)._M_elems[0].
                       super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar5 * 2) + 8) = dVar6;
    lVar5 = lVar5 + 8;
  } while (lVar5 == 8);
  peVar3 = (this->m_driver).
           super___shared_ptr<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  lVar5 = 0;
  do {
    dVar2 = *(double *)((long)(peVar3->steer_angles)._M_elems + lVar5 + 0x10);
    dVar6 = -1.4835298641951802;
    if ((-1.4835298641951802 <= dVar2) && (dVar6 = dVar2, 1.4835298641951802 < dVar2)) {
      dVar6 = 1.4835298641951802;
    }
    *(double *)
     (*(long *)((long)&(this->m_bogie_motor_funcs)._M_elems[0].
                       super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar5 * 2) + 8) = dVar6;
    lVar5 = lVar5 + 8;
  } while (lVar5 == 8);
  return;
}

Assistant:

void Curiosity::Update() {
    double time = m_system->GetChTime();
    m_driver->Update(time);

    if (m_driver->GetDriveMotorType() == CuriosityDriver::DriveMotorType::SPEED) {
        for (int i = 0; i < 6; i++) {
            double driving = m_driver->drive_speeds[i];
            m_drive_motor_funcs[i]->SetSetpoint(driving, time);
        }
    }

    for (int i = 0; i < 2; i++) {
        double steering = m_driver->steer_angles[i];
        // Enforce maximum steering angle
        ChClampValue(steering, -max_steer_angle, +max_steer_angle);
        m_rocker_motor_funcs[i]->Set_yconst(steering);
    }

    for (int i = 0; i < 2; i++) {
        double steering = m_driver->steer_angles[i + 2];
        // Enforce maximum steering angle
        ChClampValue(steering, -max_steer_angle, +max_steer_angle);
        m_bogie_motor_funcs[i]->Set_yconst(steering);
    }
}